

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadBDSEph(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  ushort uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  unsigned_short *Message;
  
  iVar8 = 6;
  if ((this->Head).MessageID == 0x6a0) {
    iVar8 = (this->Head).MessageLength;
    iVar5 = (int)((long)iVar8 + 4U);
    iVar9 = -1;
    if (-5 < iVar8) {
      iVar9 = iVar5;
    }
    Message = (unsigned_short *)operator_new__((long)iVar9);
    iVar9 = socketdata->pos;
    if (socketdata->len - iVar9 < iVar8) {
      socketdata->pos = iVar9 + -0x1c;
      iVar8 = 2;
    }
    else {
      memcpy(Message,socketdata->buff + iVar9,(long)iVar8 + 4U);
      socketdata->pos = iVar9 + iVar5;
      bVar7 = CRCCheck(HeadBuff,(uchar *)Message,iVar8,0xc4);
      if (bVar7) {
        uVar1 = *Message - 1;
        iVar8 = 4;
        if (uVar1 < 0x41) {
          this->BDSEph[uVar1].PRN = *Message;
          this->BDSEph[uVar1].sys = BDS;
          this->BDSEph[uVar1].RefTime.Week = *(int *)(Message + 2);
          this->BDSEph[uVar1].URA = *(double *)(Message + 4);
          this->BDSEph[uVar1].HealthStatus = *(int *)(Message + 8);
          dVar6 = *(double *)(Message + 0xe);
          pdVar2 = &this->BDSEph[uVar1].tgd;
          *pdVar2 = *(double *)(Message + 10);
          pdVar2[1] = dVar6;
          this->BDSEph[uVar1].toc = (double)*(int *)(Message + 0x14);
          dVar6 = *(double *)(Message + 0x1a);
          pdVar2 = &this->BDSEph[uVar1].af0;
          *pdVar2 = *(double *)(Message + 0x16);
          pdVar2[1] = dVar6;
          this->BDSEph[uVar1].af2 = *(double *)(Message + 0x1e);
          this->BDSEph[uVar1].RefTime.SOW = (double)*(int *)(Message + 0x24);
          this->BDSEph[uVar1].w = *(double *)(Message + 0x2e);
          auVar3 = *(undefined1 (*) [16])(Message + 0x26);
          auVar4._8_4_ = auVar3._0_4_;
          auVar4._0_8_ = auVar3._8_8_;
          auVar4._12_4_ = auVar3._4_4_;
          this->BDSEph[uVar1].ecc = (double)auVar3._8_8_;
          this->BDSEph[uVar1].sqrtA = (double)auVar4._8_8_;
          dVar6 = *(double *)(Message + 0x36);
          pdVar2 = &this->BDSEph[uVar1].deltaN;
          *pdVar2 = *(double *)(Message + 0x32);
          pdVar2[1] = dVar6;
          dVar6 = *(double *)(Message + 0x3e);
          pdVar2 = &this->BDSEph[uVar1].omegaO;
          *pdVar2 = *(double *)(Message + 0x3a);
          pdVar2[1] = dVar6;
          dVar6 = *(double *)(Message + 0x46);
          pdVar2 = &this->BDSEph[uVar1].I0;
          *pdVar2 = *(double *)(Message + 0x42);
          pdVar2[1] = dVar6;
          dVar6 = *(double *)(Message + 0x4e);
          pdVar2 = &this->BDSEph[uVar1].cuc;
          *pdVar2 = *(double *)(Message + 0x4a);
          pdVar2[1] = dVar6;
          dVar6 = *(double *)(Message + 0x56);
          pdVar2 = &this->BDSEph[uVar1].crc;
          *pdVar2 = *(double *)(Message + 0x52);
          pdVar2[1] = dVar6;
          dVar6 = *(double *)(Message + 0x5e);
          pdVar2 = &this->BDSEph[uVar1].cic;
          *pdVar2 = *(double *)(Message + 0x5a);
          pdVar2[1] = dVar6;
          operator_delete__(Message);
          iVar8 = 0;
        }
      }
      else {
        operator_delete__(Message);
        iVar8 = 3;
      }
    }
  }
  return iVar8;
}

Assistant:

int ReadData::ReadBDSEph(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 1696)
        return CONFLICT_ID;
    
    char* buff = new char [Head.MessageLength + 4];
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, 196)) {
        delete[] buff;
        return CRC_FAILED;
    }
    // cout << "BDS   " << endl;
    try
    {
        unsigned short int prn = U2I((unsigned char*)buff, 4) - 1;
        // cout << prn << endl;
        if(prn < 0 || prn > MAXBDSSRN)
            return INVALID_PRN;
        this->BDSEph[prn].PRN = prn + 1;
        this->BDSEph[prn].sys = BDS;

        this->BDSEph[prn].RefTime.Week = U2I((unsigned char*)(buff + 4), 4);
        this->BDSEph[prn].URA = C2D(buff + 8, 8);
        this->BDSEph[prn].HealthStatus = U2I((unsigned char*)(buff + 16), 4);
        this->BDSEph[prn].tgd = C2D(buff + 20, 8);
        this->BDSEph[prn].tgd2 = C2D(buff + 28, 8);
        this->BDSEph[prn].toc = U2I((unsigned char*)(buff + 40), 4);
        this->BDSEph[prn].af0 = C2D(buff + 44, 8);
        this->BDSEph[prn].af1 = C2D(buff + 52, 8);
        this->BDSEph[prn].af2 = C2D(buff + 60, 8);
        this->BDSEph[prn].RefTime.SOW = U2I((unsigned char*)(buff + 72), 4);
        this->BDSEph[prn].ecc = C2D((buff + 84), 8);
        this->BDSEph[prn].w = C2D(buff + 92, 8);
        this->BDSEph[prn].sqrtA = C2D(buff + 76, 8);
        this->BDSEph[prn].deltaN = C2D(buff + 100, 8);
        this->BDSEph[prn].M0 = C2D(buff + 108, 8);
        this->BDSEph[prn].omegaO = C2D(buff + 116, 8);
        this->BDSEph[prn].omegaORate = C2D(buff + 124, 8);
        this->BDSEph[prn].I0 = C2D(buff + 132, 8);
        this->BDSEph[prn].I0Rate = C2D(buff + 140, 8);
        this->BDSEph[prn].cuc = C2D(buff + 148, 8);
        this->BDSEph[prn].cus = C2D(buff + 156, 8);
        this->BDSEph[prn].crc = C2D(buff + 164, 8);
        this->BDSEph[prn].crs = C2D(buff + 172, 8);
        this->BDSEph[prn].cic = C2D(buff + 180, 8);
        this->BDSEph[prn].cis = C2D(buff + 188, 8);
        // cout << BDSEph[prn].sqrtA << endl;
    }
    catch(...)
    {
        cout << "error happened when reading bds eph" << endl;
        return UNSUPPORTED_MSG;
    }
    delete[] buff;
    return 0;
}